

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

boolean arti_reflects(obj *obj)

{
  boolean bVar1;
  artifact *paVar2;
  
  if ((obj == (obj *)0x0) || ((long)obj->oartifact == 0)) {
    paVar2 = (artifact *)0x0;
  }
  else {
    paVar2 = artilist + obj->oartifact;
  }
  if ((paVar2 == (artifact *)0x0) ||
     ((((obj->owornmask & 0xffffefffU) == 0 || (bVar1 = '\x01', (paVar2->spfx & 0x4000000) == 0)) &&
      (bVar1 = '\x01', (paVar2->cspfx & 0x4000000) == 0)))) {
    bVar1 = '\0';
  }
  return bVar1;
}

Assistant:

boolean arti_reflects(struct obj *obj)
{
    const struct artifact *arti = get_artifact(obj);

    if (arti) {      
	/* while being worn */
	if ((obj->owornmask & ~W_ART) && (arti->spfx & SPFX_REFLECT))
	    return TRUE;
	/* just being carried */
	if (arti->cspfx & SPFX_REFLECT) return TRUE;
    }
    return FALSE;
}